

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pty.c
# Opt level: O2

void pty_real_select_result(Pty *pty,int fd,int event,int status)

{
  Seat *pSVar1;
  int iVar2;
  ssize_t sVar3;
  int *piVar4;
  size_t sVar5;
  char *pcVar6;
  size_t sVar7;
  uint uVar8;
  long lVar9;
  char buf [4096];
  
  if (event < 0) {
    if (((status & 0x7fU) != 0) && ((int)((status & 0x7fU) * 0x1000000 + 0x1000000) < 0x2000000)) {
      return;
    }
    pty->child_dead = true;
    del234(ptys_by_pid,pty);
    pty->exit_code = status;
    if (pty->master_fd < 0) {
      return;
    }
  }
  else {
    if (event == 2) {
      pty_try_write(pty);
      return;
    }
    if (event != 1) {
      return;
    }
    iVar2 = pty->master_o;
    sVar3 = read(fd,buf,0x1000);
    uVar8 = (uint)sVar3;
    if ((int)uVar8 < 0 && pty->master_fd == fd) {
      piVar4 = __errno_location();
      if (*piVar4 != 5) {
LAB_00112902:
        perror("read pty master");
        exit(1);
      }
    }
    else if (uVar8 != 0) {
      if (-1 < (int)uVar8) {
        sVar5 = (*pty->seat->vt->output)
                          (pty->seat,(uint)(iVar2 != fd),buf,(ulong)(uVar8 & 0x7fffffff));
        pty->output_backlog = sVar5;
        pty_uxsel_setup(pty);
        return;
      }
      goto LAB_00112902;
    }
    uxsel_del(buf._4_4_);
    close(fd);
    if (pty->master_fd == fd) {
      pty->master_fd = -1;
    }
    if (pty->master_o == fd) {
      pty->master_o = -1;
    }
    if (pty->master_e == fd) {
      pty->master_e = -1;
    }
    if (iVar2 != fd) {
      return;
    }
    pty_try_wait();
    if (pty->child_dead == false) {
      pty->exit_code = 0;
    }
  }
  if (pty->finished != false) {
    return;
  }
  for (lVar9 = 0x28; lVar9 != 0x58; lVar9 = lVar9 + 0x10) {
    if (-1 < *(int *)((long)pty->pipefds + lVar9 + -0x10)) {
      uxsel_del(buf._4_4_);
    }
  }
  pty_close(pty);
  pty->finished = true;
  iVar2 = conf_get_int(pty->conf,4);
  if (iVar2 == 2) {
    uVar8 = pty->exit_code;
    if (uVar8 == 0) goto LAB_001128e1;
  }
  else {
    if (iVar2 != 1) goto LAB_001128e1;
    uVar8 = pty->exit_code;
  }
  uVar8 = uVar8 & 0x7f;
  if (uVar8 == 0) {
    pcVar6 = dupprintf("\r\n[pterm: process terminated with exit code %d]\r\n");
  }
  else if ((int)(uVar8 * 0x1000000 + 0x1000000) < 0x2000000) {
    pcVar6 = dupprintf("\r\n[pterm: process terminated]\r\n");
  }
  else {
    pcVar6 = strsignal(uVar8);
    pcVar6 = dupprintf("\r\n[pterm: process terminated on signal %d (%s)]\r\n",(ulong)uVar8,pcVar6);
  }
  pSVar1 = pty->seat;
  sVar7 = strlen(pcVar6);
  (*pSVar1->vt->output)(pSVar1,SEAT_OUTPUT_STDOUT,pcVar6,sVar7);
  safefree(pcVar6);
LAB_001128e1:
  (*pty->seat->vt->eof)(pty->seat);
  (*pty->seat->vt->notify_remote_exit)(pty->seat);
  return;
}

Assistant:

static void pty_real_select_result(Pty *pty, int fd, int event, int status)
{
    char buf[4096];
    int ret;
    bool finished = false;

    if (event < 0) {
        /*
         * We've been called because our child process did
         * something. `status' tells us what.
         */
        if ((WIFEXITED(status) || WIFSIGNALED(status))) {
            /*
             * The primary child process died.
             */
            pty->child_dead = true;
            del234(ptys_by_pid, pty);
            pty->exit_code = status;

            /*
             * If this is an ordinary pty session, this is also the
             * moment to terminate the whole backend.
             *
             * We _could_ instead keep the terminal open for remaining
             * subprocesses to output to, but conventional wisdom
             * seems to feel that that's the Wrong Thing for an
             * xterm-alike, so we bail out now (though we don't
             * necessarily _close_ the window, depending on the state
             * of Close On Exit). This would be easy enough to change
             * or make configurable if necessary.
             */
            if (pty->master_fd >= 0)
                finished = true;
        }
    } else {
        if (event == SELECT_R) {
            bool is_stdout = (fd == pty->master_o);

            ret = read(fd, buf, sizeof(buf));

            /*
             * Treat EIO on a pty master as equivalent to EOF (because
             * that's how the kernel seems to report the event where
             * the last process connected to the other end of the pty
             * went away).
             */
            if (fd == pty->master_fd && ret < 0 && errno == EIO)
                ret = 0;

            if (ret == 0) {
                /*
                 * EOF on this input fd, so to begin with, we may as
                 * well close it, and remove all references to it in
                 * the pty's fd fields.
                 */
                uxsel_del(fd);
                close(fd);
                if (pty->master_fd == fd)
                    pty->master_fd = -1;
                if (pty->master_o == fd)
                    pty->master_o = -1;
                if (pty->master_e == fd)
                    pty->master_e = -1;

                if (is_stdout) {
                    /*
                     * We assume a clean exit if the pty (or stdout
                     * pipe) has closed, but the actual child process
                     * hasn't. The only way I can imagine this
                     * happening is if it detaches itself from the pty
                     * and goes daemonic - in which case the expected
                     * usage model would precisely _not_ be for the
                     * pterm window to hang around!
                     */
                    finished = true;
                    pty_try_wait(); /* one last effort to collect exit code */
                    if (!pty->child_dead)
                        pty->exit_code = 0;
                }
            } else if (ret < 0) {
                perror("read pty master");
                exit(1);
            } else if (ret > 0) {
                pty->output_backlog = seat_output(
                    pty->seat, !is_stdout, buf, ret);
                pty_uxsel_setup(pty);
            }
        } else if (event == SELECT_W) {
            /*
             * Attempt to send data down the pty.
             */
            pty_try_write(pty);
        }
    }

    if (finished && !pty->finished) {
        int close_on_exit;
        int i;

        for (i = 0; i < 3; i++)
            if (pty->fds[i].fd >= 0)
                uxsel_del(pty->fds[i].fd);

        pty_close(pty);

        pty->finished = true;

        /*
         * This is a slight layering-violation sort of hack: only
         * if we're not closing on exit (COE is set to Never, or to
         * Only On Clean and it wasn't a clean exit) do we output a
         * `terminated' message.
         */
        close_on_exit = conf_get_int(pty->conf, CONF_close_on_exit);
        if (close_on_exit == FORCE_OFF ||
            (close_on_exit == AUTO && pty->exit_code != 0)) {
            char *message;
            if (WIFEXITED(pty->exit_code)) {
                message = dupprintf(
                    "\r\n[pterm: process terminated with exit code %d]\r\n",
                    WEXITSTATUS(pty->exit_code));
            } else if (WIFSIGNALED(pty->exit_code)) {
#if !HAVE_STRSIGNAL
                message = dupprintf(
                    "\r\n[pterm: process terminated on signal %d]\r\n",
                    WTERMSIG(pty->exit_code));
#else
                message = dupprintf(
                    "\r\n[pterm: process terminated on signal %d (%s)]\r\n",
                    WTERMSIG(pty->exit_code),
                    strsignal(WTERMSIG(pty->exit_code)));
#endif
            } else {
                /* _Shouldn't_ happen, but if it does, a vague message
                 * is better than no message at all */
                message = dupprintf("\r\n[pterm: process terminated]\r\n");
            }
            seat_stdout_pl(pty->seat, ptrlen_from_asciz(message));
            sfree(message);
        }

        seat_eof(pty->seat);
        seat_notify_remote_exit(pty->seat);
    }
}